

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O0

void test_case_unsigned_div(zt_unit_test *test,void *data)

{
  uchar uVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  zt_unit_test *in_RDI;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  
  uVar1 = zt_uchar_div('\x01','\x7f');
  if (uVar1 != '\0') {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_div(1, CHAR_MAX) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1e4);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_div('\x7f','\x01');
  if (uVar1 != '\x7f') {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_div(CHAR_MAX, 1) == CHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1e5);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_div('\0','\x7f');
  if (uVar1 != '\0') {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_div(0, CHAR_MAX) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1e7);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar1 = zt_uchar_div('\x7f','\x02');
  if (uVar1 != '?') {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uchar_div(CHAR_MAX, 2) == CHAR_MAX / 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1ea);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_div(1,0x7f);
  if (uVar2 != 0) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_div(1, CHAR_MAX) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1ed);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_div(0x7f,1);
  if (uVar2 != 0x7f) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_div(CHAR_MAX, 1) == CHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1ee);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_div(0,0x7f);
  if (uVar2 != 0) {
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_div(0, CHAR_MAX) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1f0);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  uVar2 = zt_ushort_div(0x7f,2);
  if (uVar2 == 0x3f) {
    zt_unit_test_add_assertion(in_RDI);
    uVar3 = zt_uint_div(1,0x7fffffff);
    if (uVar3 != 0) {
      iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_div(1, INT_MAX) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1f6);
      if (iVar4 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    uVar3 = zt_uint_div(0x7fffffff,1);
    if (uVar3 != 0x7fffffff) {
      iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_div(INT_MAX, 1) == INT_MAX",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1f7);
      if (iVar4 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    uVar3 = zt_uint_div(0,0x7fffffff);
    if (uVar3 != 0) {
      iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_div(0, INT_MAX) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1f9);
      if (iVar4 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    uVar3 = zt_uint_div(0x7fffffff,2);
    if (uVar3 == 0x3fffffff) {
      zt_unit_test_add_assertion(in_RDI);
      return;
    }
    iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_uint_div(INT_MAX, 2) == INT_MAX / 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1fc);
    if (iVar4 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  iVar4 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_ushort_div(CHAR_MAX, 2) == CHAR_MAX / 2",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                         ,499);
  if (iVar4 == 0) {
    in_RDI->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)in_RDI->env,1);
}

Assistant:

static void
test_case_unsigned_div(struct zt_unit_test *test, void *data UNUSED)
{
    /* unsigned division */
    /* char */
    ZT_UNIT_ASSERT(test, zt_uchar_div(1, CHAR_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_uchar_div(CHAR_MAX, 1) == CHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_uchar_div(0, CHAR_MAX) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_uchar_div(CHAR_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_uchar_div(CHAR_MAX, 2) == CHAR_MAX / 2);

    /* char */
    ZT_UNIT_ASSERT(test, zt_ushort_div(1, CHAR_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_ushort_div(CHAR_MAX, 1) == CHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_ushort_div(0, CHAR_MAX) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_ushort_div(CHAR_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_ushort_div(CHAR_MAX, 2) == CHAR_MAX / 2);

    /* int */
    ZT_UNIT_ASSERT(test, zt_uint_div(1, INT_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_uint_div(INT_MAX, 1) == INT_MAX);

    ZT_UNIT_ASSERT(test, zt_uint_div(0, INT_MAX) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_uint_div(INT_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_uint_div(INT_MAX, 2) == INT_MAX / 2);

# ifndef __x86_64__
    /* long */
    ZT_UNIT_ASSERT(test, zt_ulong_div(1, LONG_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_ulong_div(LONG_MAX, 1) == LONG_MAX);

    ZT_UNIT_ASSERT(test, zt_ulong_div(0, LONG_MAX) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_ulong_div(LONG_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_ulong_div(LONG_MAX, 2) == LONG_MAX / 2);
# endif /* ifndef __x86_64__ */
}